

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void apply_imputation_results<PredictionData<float,unsigned_long>,ImputedData<unsigned_long,long_double>>
               (PredictionData<float,_unsigned_long> *prediction_data,
               ImputedData<unsigned_long,_long_double> *imp,Imputer *imputer,size_t row)

{
  longdouble lVar1;
  size_type sVar2;
  bool bVar3;
  uint uVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  difference_type dVar8;
  reference pvVar9;
  reference pvVar10;
  long in_RCX;
  long *in_RDX;
  vector<long_double,_std::allocator<long_double>_> *in_RSI;
  long *in_RDI;
  double __value;
  double __value_00;
  double __value_01;
  double __value_02;
  double __value_03;
  double __value_04;
  size_t ix_4;
  size_t ix_3;
  unsigned_long ix_2;
  size_t ix_1;
  size_t ix;
  size_t pos;
  size_t col;
  unkbyte10 in_stack_ffffffffffffff18;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  in_stack_ffffffffffffff28;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  in_stack_ffffffffffffff30;
  longdouble in_stack_ffffffffffffff38;
  pointer local_78;
  pointer local_50;
  ulong local_48;
  pointer local_40;
  pointer local_38;
  size_type local_30;
  
  local_30 = 0;
  if ((*(byte *)(in_RDI + 3) & 1) == 0) {
    for (local_40 = (pointer)0x0;
        local_40 <
        in_RSI[9].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start; local_40 = (pointer)((long)local_40 + 1)) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 6),
                          (size_type)local_40);
      sVar2 = *pvVar5;
      pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                         (in_RSI + 1,(size_type)local_40);
      if (*(longdouble *)pvVar6 <= (longdouble)0) {
LAB_006229f5:
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),sVar2);
        *(float *)(*in_RDI + (sVar2 + in_RCX * *in_RDX) * 4) = (float)*pvVar7;
      }
      else {
        pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (in_RSI,(size_type)local_40);
        in_stack_ffffffffffffff18 = *(unkbyte10 *)pvVar6;
        uVar4 = std::isnan(__value_01);
        if ((uVar4 & 1) != 0) goto LAB_006229f5;
        pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (in_RSI,(size_type)local_40);
        in_stack_ffffffffffffff18 = *(unkbyte10 *)pvVar6;
        uVar4 = std::isinf(__value_02);
        if ((uVar4 & 1) != 0) goto LAB_006229f5;
        pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (in_RSI,(size_type)local_40);
        if ((*(longdouble *)pvVar6 == (longdouble)0) &&
           (!NAN(*(longdouble *)pvVar6) && !NAN((longdouble)0))) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),sVar2);
          uVar4 = std::isnan(*pvVar7);
          if ((uVar4 & 1) != 0) goto LAB_006229f5;
        }
        pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (in_RSI,(size_type)local_40);
        lVar1 = *(longdouble *)pvVar6;
        pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (in_RSI + 1,(size_type)local_40);
        *(float *)(*in_RDI + (sVar2 + in_RCX * *in_RDX) * 4) =
             (float)(lVar1 / *(longdouble *)pvVar6);
      }
    }
  }
  else {
    for (local_38 = (pointer)0x0;
        local_38 <
        in_RSI[9].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start; local_38 = (pointer)((long)local_38 + 1)) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 6),
                          (size_type)local_38);
      sVar2 = *pvVar5;
      pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                         (in_RSI + 1,(size_type)local_38);
      if (*(longdouble *)pvVar6 <= (longdouble)0) {
LAB_006227f5:
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),sVar2);
        *(float *)(*in_RDI + (in_RCX + sVar2 * in_RDI[2]) * 4) = (float)*pvVar7;
      }
      else {
        pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (in_RSI,(size_type)local_38);
        in_stack_ffffffffffffff18 = *(unkbyte10 *)pvVar6;
        uVar4 = std::isnan(__value);
        if ((uVar4 & 1) != 0) goto LAB_006227f5;
        pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (in_RSI,(size_type)local_38);
        in_stack_ffffffffffffff18 = *(unkbyte10 *)pvVar6;
        uVar4 = std::isinf(__value_00);
        if ((uVar4 & 1) != 0) goto LAB_006227f5;
        pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (in_RSI,(size_type)local_38);
        if ((*(longdouble *)pvVar6 == (longdouble)0) &&
           (!NAN(*(longdouble *)pvVar6) && !NAN((longdouble)0))) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),sVar2);
          uVar4 = std::isnan(*pvVar7);
          if ((uVar4 & 1) != 0) goto LAB_006227f5;
        }
        pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (in_RSI,(size_type)local_38);
        lVar1 = *(longdouble *)pvVar6;
        pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (in_RSI + 1,(size_type)local_38);
        *(float *)(*in_RDI + (in_RCX + sVar2 * in_RDI[2]) * 4) =
             (float)(lVar1 / *(longdouble *)pvVar6);
      }
    }
  }
  if (in_RDI[9] != 0) {
    for (local_48 = *(ulong *)(in_RDI[0xb] + in_RCX * 8);
        local_48 < *(ulong *)(in_RDI[0xb] + 8 + in_RCX * 8); local_48 = local_48 + 1) {
      uVar4 = std::isnan((double)(ulong)*(uint *)(in_RDI[9] + local_48 * 4));
      if (((uVar4 & 1) != 0) ||
         (uVar4 = std::isinf((double)(ulong)*(uint *)(in_RDI[9] + local_48 * 4)), (uVar4 & 1) != 0))
      {
        pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                           (in_RSI + 5,local_30);
        if (*(longdouble *)pvVar6 <= (longdouble)0) {
LAB_00622beb:
          in_stack_ffffffffffffff30._M_current = (longdouble *)(in_RDX + 8);
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 8),
                              local_30);
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              in_stack_ffffffffffffff30._M_current,*pvVar5);
          *(float *)(in_RDI[9] + local_48 * 4) = (float)*pvVar7;
        }
        else {
          pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                             (in_RSI + 4,local_30);
          in_stack_ffffffffffffff18 = *(unkbyte10 *)pvVar6;
          uVar4 = std::isnan(__value_03);
          if ((uVar4 & 1) != 0) goto LAB_00622beb;
          pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                             (in_RSI + 4,local_30);
          in_stack_ffffffffffffff18 = *(unkbyte10 *)pvVar6;
          uVar4 = std::isinf(__value_04);
          if ((uVar4 & 1) != 0) goto LAB_00622beb;
          pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                             (in_RSI + 4,local_30);
          in_stack_ffffffffffffff38 = *(longdouble *)pvVar6;
          pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                             (in_RSI + 5,local_30);
          *(float *)(in_RDI[9] + local_48 * 4) =
               (float)(in_stack_ffffffffffffff38 / *(longdouble *)pvVar6);
        }
        local_30 = local_30 + 1;
      }
    }
  }
  if ((*(byte *)(in_RDI + 3) & 1) == 0) {
    for (local_78 = (pointer)0x0;
        local_78 <
        in_RSI[9].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish; local_78 = (pointer)((long)local_78 + 1)) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 7),
                          (size_type)local_78);
      sVar2 = *pvVar5;
      std::
      vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      std::vector<long_double,_std::allocator<long_double>_>::begin
                ((vector<long_double,_std::allocator<long_double>_> *)in_stack_ffffffffffffff18);
      std::
      vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      std::vector<long_double,_std::allocator<long_double>_>::begin
                ((vector<long_double,_std::allocator<long_double>_> *)in_stack_ffffffffffffff18);
      std::
      vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      std::vector<long_double,_std::allocator<long_double>_>::end
                ((vector<long_double,_std::allocator<long_double>_> *)in_stack_ffffffffffffff18);
      std::
      max_element<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
                ((__normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
                  )SUB108(in_stack_ffffffffffffff38,0),in_stack_ffffffffffffff30);
      dVar8 = std::
              distance<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
                        (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      *(int *)(in_RDI[1] + (sVar2 + in_RCX * in_RDX[1]) * 4) = (int)dVar8;
      if (*(int *)(in_RDI[1] + (sVar2 + in_RCX * in_RDX[1]) * 4) == 0) {
        bVar3 = std::
                vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ::empty((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                         *)in_stack_ffffffffffffff30._M_current);
        if (!bVar3) {
          std::
          vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
          ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                        *)(in_RSI + 2),sVar2);
          bVar3 = std::vector<long_double,_std::allocator<long_double>_>::empty
                            ((vector<long_double,_std::allocator<long_double>_> *)
                             in_stack_ffffffffffffff30._M_current);
          if (!bVar3) {
            pvVar9 = std::
                     vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                     ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                   *)(in_RSI + 2),sVar2);
            pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[](pvVar9,0);
            if (*(longdouble *)pvVar6 <= (longdouble)0) {
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDX + 0xb),sVar2);
              *(value_type *)(in_RDI[1] + (sVar2 + in_RCX * in_RDX[1]) * 4) = *pvVar10;
            }
            goto LAB_0062312a;
          }
        }
        *(undefined4 *)(in_RDI[1] + (sVar2 + in_RCX * in_RDX[1]) * 4) = 0xffffffff;
      }
LAB_0062312a:
    }
  }
  else {
    for (local_50 = (pointer)0x0;
        local_50 <
        in_RSI[9].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish; local_50 = (pointer)((long)local_50 + 1)) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 7),
                          (size_type)local_50);
      sVar2 = *pvVar5;
      std::
      vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      std::vector<long_double,_std::allocator<long_double>_>::begin
                ((vector<long_double,_std::allocator<long_double>_> *)in_stack_ffffffffffffff18);
      std::
      vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      std::vector<long_double,_std::allocator<long_double>_>::begin
                ((vector<long_double,_std::allocator<long_double>_> *)in_stack_ffffffffffffff18);
      std::
      vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      std::vector<long_double,_std::allocator<long_double>_>::end
                ((vector<long_double,_std::allocator<long_double>_> *)in_stack_ffffffffffffff18);
      std::
      max_element<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
                ((__normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
                  )SUB108(in_stack_ffffffffffffff38,0),in_stack_ffffffffffffff30);
      dVar8 = std::
              distance<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
                        (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      *(int *)(in_RDI[1] + (in_RCX + sVar2 * in_RDI[2]) * 4) = (int)dVar8;
      if (*(int *)(in_RDI[1] + (in_RCX + sVar2 * in_RDI[2]) * 4) == 0) {
        bVar3 = std::
                vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ::empty((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                         *)in_stack_ffffffffffffff30._M_current);
        if (!bVar3) {
          std::
          vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
          ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                        *)(in_RSI + 2),sVar2);
          bVar3 = std::vector<long_double,_std::allocator<long_double>_>::empty
                            ((vector<long_double,_std::allocator<long_double>_> *)
                             in_stack_ffffffffffffff30._M_current);
          if (!bVar3) {
            pvVar9 = std::
                     vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                     ::operator[]((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                   *)(in_RSI + 2),sVar2);
            pvVar6 = std::vector<long_double,_std::allocator<long_double>_>::operator[](pvVar9,0);
            if (*(longdouble *)pvVar6 <= (longdouble)0) {
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDX + 0xb),sVar2);
              *(value_type *)(in_RDI[1] + (in_RCX + sVar2 * in_RDI[2]) * 4) = *pvVar10;
            }
            goto LAB_00622ed7;
          }
        }
        *(undefined4 *)(in_RDI[1] + (in_RCX + sVar2 * in_RDI[2]) * 4) = 0xffffffff;
      }
LAB_00622ed7:
    }
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}